

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void print_fasta(FILE *fp,char *name,char *comment,char *seq,size_t colwidth)

{
  size_t sVar1;
  char *__s;
  char *seqbuf;
  int local_38;
  int i;
  int x;
  int l;
  size_t colwidth_local;
  char *seq_local;
  char *comment_local;
  char *name_local;
  FILE *fp_local;
  
  sVar1 = strlen(seq);
  seqbuf._4_4_ = 0;
  __s = (char *)malloc(colwidth + 1);
  if (__s != (char *)0x0) {
    if (colwidth < (ulong)(long)(int)sVar1) {
      if (comment == (char *)0x0) {
        fprintf((FILE *)fp,">%s\n",name);
      }
      else {
        fprintf((FILE *)fp,">%s %s\n",name,comment);
      }
      for (local_38 = 0; local_38 < (int)sVar1; local_38 = local_38 + 1) {
        if ((ulong)(long)seqbuf._4_4_ < colwidth) {
          __s[seqbuf._4_4_] = seq[local_38];
          seqbuf._4_4_ = seqbuf._4_4_ + 1;
        }
        else {
          __s[seqbuf._4_4_] = '\0';
          fprintf((FILE *)fp,"%s\n",__s);
          *__s = '\0';
          *__s = seq[local_38];
          seqbuf._4_4_ = 1;
        }
      }
      if ((ulong)(long)seqbuf._4_4_ < colwidth) {
        __s[seqbuf._4_4_] = '\0';
      }
      sVar1 = strlen(__s);
      if (sVar1 != 0) {
        fprintf((FILE *)fp,"%s\n",__s);
      }
    }
    else if (comment == (char *)0x0) {
      fprintf((FILE *)fp,">%s\n%s\n",name,seq);
    }
    else {
      fprintf((FILE *)fp,">%s %s\n%s\n",name,comment,seq);
    }
    free(__s);
    return;
  }
  fprintf(_stderr,"print_seq: out of memory for seqbuf!\n");
  exit(1);
}

Assistant:

void print_fasta(FILE *fp, char *name, char *comment, char *seq, size_t colwidth)
{
	int l = strlen(seq);   /* sequence length */
	int x,i=0;
	char *seqbuf = NULL;
	seqbuf = (char *)malloc(sizeof(char) * (colwidth + 1));
	if (seqbuf == NULL) {
		fprintf(stderr,"print_seq: out of memory for seqbuf!\n");
		exit(EXIT_FAILURE);
	}

	if (l > colwidth) {                  /* seqlength is > column length - split sequence */
		if (comment == NULL)
			fprintf(fp, ">%s\n",name);
		else
			fprintf(fp, ">%s %s\n",name,comment);

		for (x=0; x<l;x++) {
			if (i < colwidth) {                     /* there's less sequence than the column width */
				seqbuf[i] = seq[x];
				i++;
			} else {                         /* i is >= column width, so print this line */
				seqbuf[i] = '\0';            /* set last position in string to null */
				fprintf(fp, "%s\n",seqbuf);       /* print this line */
				i = 0;                       /* reset i */
				seqbuf[0] = '\0';            /* reset buffer */
				seqbuf[i] = seq[x];   /* set this buffer line to current sequence char */
				i++;
			}
		}
		if (i<colwidth)
			seqbuf[i] = '\0';
		if (strlen(seqbuf) > 0)
			fprintf(fp, "%s\n",seqbuf);
	} else {                     /* seqlength < column length, so just print the full sequence */
		if (comment == NULL)
			fprintf(fp, ">%s\n%s\n",name,seq);
		else
			fprintf(fp, ">%s %s\n%s\n",name,comment,seq);
	}
	free(seqbuf);
}